

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O2

void __thiscall glslang::TPpContext::pushInput(TPpContext *this,tInput *in)

{
  tInput *local_10;
  
  local_10 = in;
  std::vector<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>::
  push_back(&this->inputStack,&local_10);
  (*local_10->_vptr_tInput[10])();
  return;
}

Assistant:

void pushInput(tInput* in)
    {
        inputStack.push_back(in);
        in->notifyActivated();
    }